

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::
make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>::
operator()(make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
           *this,stringstream *msg,char *arg,time_point args,char *args_1,time_point args_2)

{
  make_exception<hta::Clock::time_point,_const_char_*,_hta::Clock::time_point> local_39;
  char *local_38;
  char *args_local_1;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  *this_local;
  time_point args_local_2;
  time_point args_local;
  
  local_38 = args_1;
  args_local_1 = arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  this_local = (make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
                *)args_2.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r;
  args_local_2 = args;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>::operator()
            (&local_39,(stringstream *)arg_local,args_local_2,local_38,(time_point)this_local);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }